

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoogleNamerTest.cpp
# Opt level: O2

void __thiscall
TestCaseNameDifferentNameThanFile_TestName_Test::TestBody
          (TestCaseNameDifferentNameThanFile_TestName_Test *this)

{
  char *message;
  AssertHelper AStack_48;
  AssertionResult gtest_ar;
  string local_30;
  ApprovalTestNamer namer;
  
  namer.super_ApprovalNamer._vptr_ApprovalNamer = (ApprovalNamer)&PTR__ApprovalNamer_00171b90;
  ApprovalTests::ApprovalTestNamer::getTestName_abi_cxx11_(&local_30,&namer);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[43]>
            ((internal *)&gtest_ar,"namer.getTestName()",
             "\"TestCaseNameDifferentNameThanFile.TestName\"",&local_30,
             (char (*) [43])"TestCaseNameDifferentNameThanFile.TestName");
  std::__cxx11::string::~string((string *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/GoogleTest_Tests/namers/GoogleNamerTest.cpp"
               ,0x13,message);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_30);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(GoogleNamerTest, TestSuffixMatcherBug)
{
    std::string testCaseName = "ApprovalTestsTest";
    std::string suffix = "Test";
    std::string fileName = "/a/b/c/testApprovalTests.cpp";
    auto converter = GoogleConfiguration::createIgnorableTestCaseNameSuffixCheck(suffix);
    EXPECT_EQ(converter(fileName, testCaseName), true);
}